

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

uint8_t __thiscall AmpIO::GetAmpEnableMask(AmpIO *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint local_18;
  byte local_11;
  uint i;
  uint8_t ampEnable;
  AmpIO *this_local;
  
  local_11 = 0;
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar2 == 0x514c4131) {
    uVar2 = GetStatus(this);
    local_11 = (byte)uVar2 & 0xf;
  }
  else {
    for (local_18 = 0; local_18 < this->NumMotors; local_18 = local_18 + 1) {
      bVar1 = GetAmpEnable(this,local_18);
      if (bVar1) {
        local_11 = local_11 | (byte)(1 << ((byte)local_18 & 0x1f));
      }
    }
  }
  return local_11;
}

Assistant:

uint8_t AmpIO::GetAmpEnableMask(void) const
{
    uint8_t ampEnable = 0;
    if (GetHardwareVersion() == QLA1_String) {
        // For the QLA, the following is more efficient than the general case
        ampEnable = GetStatus()&0x0000000f;
    }
    else {
        for (unsigned int i = 0; i < NumMotors; i++) {
            if (GetAmpEnable(i))
                ampEnable |= (1 << i);
        }
    }
    return ampEnable;
}